

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O3

int __thiscall ReadData::ReadRefPos(ReadData *this,FILE *file,uchar *HeadBuff)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  uchar *Message;
  size_t sVar4;
  
  iVar2 = 6;
  if ((this->Head).MessageID == 0x2f) {
    lVar3 = (long)(this->Head).MessageLength;
    sVar4 = lVar3 + 4;
    iVar2 = -1;
    if (-5 < lVar3) {
      iVar2 = (int)sVar4;
    }
    Message = (uchar *)operator_new__((long)iVar2);
    sVar4 = fread(Message,sVar4,1,(FILE *)file);
    if (sVar4 != 0) {
      iVar2 = (this->Head).MessageLength;
      bVar1 = CRCCheck(HeadBuff,Message,iVar2,iVar2);
      if (!bVar1) {
        return 3;
      }
      ReadRefPos();
    }
    iVar2 = 2;
  }
  return iVar2;
}

Assistant:

int ReadData::ReadRefPos(FILE* file, unsigned char* HeadBuff) {
    if(Head.MessageID != 47)
        return CONFLICT_ID;
    
    char* buff = new char[Head.MessageLength + 4];
    if(!fread(buff, this->Head.MessageLength + 4, 1, file))
        return FILE_OR_BUFF_END;

    try {
        if(!CRCCheck(HeadBuff, (unsigned char*)buff, Head.MessageLength, Head.MessageLength))
            return CRC_FAILED;
        UserPsrPos.B = C2D(buff + 8, 8);
        UserPsrPos.L = C2D(buff + 16, 8);
        UserPsrPos.H = C2D(buff + 24, 8);
    } 
    catch(...) {
        cout << "error happened when reading GPS ehpe" << endl;
        return UNKNOWN_ERROR;
    }
    
    delete [] buff;
   
}